

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O1

int cuddZddSymmSiftingConv(DdManager *table,int lower,int upper)

{
  uint uVar1;
  DdSubtable *pDVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  int *piVar7;
  void *__base;
  DdNode *pDVar8;
  DdNode *moves;
  DdNode *pDVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  uint initial_size;
  uint uVar14;
  size_t sVar15;
  uint uVar16;
  ulong uVar17;
  DdNode *pDVar18;
  DdHalfWord x;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  
  uVar5 = table->keysZ;
  uVar1 = table->sizeZ;
  sVar6 = (size_t)(int)uVar1;
  piVar7 = (int *)malloc(sVar6 * 4);
  zdd_entry = piVar7;
  if (piVar7 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    __base = malloc(sVar6 * 4);
    if (__base != (void *)0x0) {
      if (0 < (int)uVar1) {
        pDVar2 = table->subtableZ;
        piVar3 = table->permZ;
        sVar15 = 0;
        do {
          piVar7[sVar15] = pDVar2[piVar3[sVar15]].keys;
          *(int *)((long)__base + sVar15 * 4) = (int)sVar15;
          sVar15 = sVar15 + 1;
        } while (sVar6 != sVar15);
      }
      qsort(__base,sVar6,4,cuddZddUniqueCompare);
      if (lower <= upper) {
        puVar11 = &table->subtableZ[lower].next;
        uVar12 = lower;
        do {
          *puVar11 = uVar12;
          uVar12 = uVar12 + 1;
          puVar11 = puVar11 + 0xe;
        } while (upper + 1U != uVar12);
      }
      uVar12 = table->siftMaxVar;
      if (table->sizeZ < table->siftMaxVar) {
        uVar12 = table->sizeZ;
      }
      if (0 < (int)uVar12) {
        uVar19 = 0;
        do {
          if (table->siftMaxSwap <= zddTotalNumberSwapping) break;
          uVar10 = table->permZ[*(int *)((long)__base + uVar19 * 4)];
          if ((((int)uVar10 <= upper && lower <= (int)uVar10) &&
              (table->subtableZ[(int)uVar10].next == uVar10)) &&
             (iVar4 = cuddZddSymmSiftingAux(table,uVar10,lower,upper), iVar4 == 0))
          goto LAB_007f82d9;
          uVar19 = uVar19 + 1;
        } while (uVar12 != uVar19);
      }
      uVar12 = table->keysZ;
      if (uVar12 < uVar5) {
        do {
          piVar7 = zdd_entry;
          if (upper < lower) {
            sVar6 = 0;
          }
          else {
            pDVar2 = table->subtableZ;
            piVar3 = table->invpermZ;
            uVar19 = 0;
            uVar5 = lower;
            do {
              do {
                uVar10 = uVar5;
                uVar5 = pDVar2[(int)uVar10].next;
              } while (uVar10 < uVar5);
              iVar4 = piVar3[(int)uVar10];
              piVar7[iVar4] = pDVar2[(int)uVar10].keys;
              *(int *)((long)__base + uVar19 * 4) = iVar4;
              uVar19 = uVar19 + 1;
              uVar5 = uVar10 + 1;
            } while ((int)uVar10 < upper);
            sVar6 = uVar19 & 0xffffffff;
          }
          qsort(__base,sVar6,4,cuddZddUniqueCompare);
          uVar5 = table->siftMaxVar;
          if ((int)uVar1 < table->siftMaxVar) {
            uVar5 = uVar1;
          }
          if (0 < (int)uVar5) {
            uVar19 = 0;
            do {
              if (table->siftMaxSwap <= zddTotalNumberSwapping) break;
              pDVar2 = table->subtableZ;
              uVar10 = table->permZ[*(int *)((long)__base + uVar19 * 4)];
              uVar20 = (ulong)(int)uVar10;
              uVar16 = pDVar2[uVar20].next;
              if (uVar16 <= uVar10) {
                initial_size = table->keysZ;
                if (uVar10 == lower) {
                  pDVar8 = (DdNode *)cuddZddSymmSifting_down(table,uVar10,upper,initial_size);
                  if (pDVar8 == (DdNode *)0x0) {
LAB_007f7c6a:
                    uVar20 = (ulong)uVar10;
                    do {
                      uVar13 = (uint)uVar20;
                      uVar14 = table->subtableZ[(int)uVar13].next;
                      uVar20 = (ulong)uVar14;
                    } while (uVar13 < uVar14);
LAB_007f7c83:
                    iVar4 = (int)uVar20;
                    do {
                      uVar13 = (uint)uVar20;
                      uVar14 = table->subtableZ[(int)uVar13].next;
                      uVar20 = (ulong)uVar14;
                    } while (uVar13 < uVar14);
                    if (uVar10 - uVar16 == uVar13 - iVar4) goto LAB_007f7ca9;
                    uVar10 = table->keysZ;
                    moves = (DdNode *)cuddZddSymmSifting_up(table,iVar4,lower,uVar10);
                    iVar4 = cuddZddSymmSiftingBackward(table,(Move *)moves,uVar10);
                  }
                  else {
                    if (pDVar8 == (DdNode *)0x1) {
                      pDVar8 = (DdNode *)0x1;
                      moves = (DdNode *)0x0;
                      goto LAB_007f8275;
                    }
                    uVar20 = (ulong)pDVar8->ref;
                    if (table->subtableZ[uVar20].next != pDVar8->ref) {
                      if (pDVar8 == (DdNode *)0x0) goto LAB_007f7c6a;
                      goto LAB_007f7c83;
                    }
LAB_007f7ca9:
                    iVar4 = cuddZddSymmSiftingBackward(table,(Move *)pDVar8,initial_size);
                    moves = (DdNode *)0x0;
                  }
LAB_007f7e4e:
                  bVar21 = iVar4 == 0;
LAB_007f7e5f:
                  if (!bVar21) {
                    if (pDVar8 != (DdNode *)0x0) {
                      pDVar9 = table->nextFree;
                      do {
                        pDVar18 = pDVar8;
                        pDVar8 = (pDVar18->type).kids.T;
                        pDVar18->ref = 0;
                        pDVar18->next = pDVar9;
                        pDVar9 = pDVar18;
                      } while (pDVar8 != (DdNode *)0x0);
                      table->nextFree = pDVar18;
                    }
                    if (moves != (DdNode *)0x0) {
                      pDVar8 = table->nextFree;
                      do {
                        pDVar9 = moves;
                        moves = (pDVar9->type).kids.T;
                        pDVar9->ref = 0;
                        pDVar9->next = pDVar8;
                        pDVar8 = pDVar9;
                      } while (moves != (DdNode *)0x0);
                      table->nextFree = pDVar9;
                    }
                    goto LAB_007f7ec5;
                  }
                }
                else {
                  if (upper != uVar10) {
                    if ((int)(upper - uVar10) < (int)(uVar10 - lower)) {
                      pDVar8 = (DdNode *)cuddZddSymmSifting_down(table,uVar10,upper,initial_size);
                      if (pDVar8 != (DdNode *)0x0) {
                        if (pDVar8 != (DdNode *)0x1) {
                          uVar20 = (ulong)pDVar8->ref;
                          goto LAB_007f7ef1;
                        }
                        pDVar8 = (DdNode *)0x1;
                        moves = (DdNode *)0x0;
                        goto LAB_007f8275;
                      }
                      do {
                        uVar16 = (uint)uVar20;
                        uVar10 = table->subtableZ[(int)uVar16].next;
                        uVar20 = (ulong)uVar10;
                      } while (uVar16 < uVar10);
LAB_007f7ef1:
                      iVar4 = (int)uVar20;
                      uVar17 = uVar20;
                      do {
                        uVar16 = (uint)uVar17;
                        uVar10 = table->subtableZ[(int)uVar16].next;
                        uVar17 = (ulong)uVar10;
                      } while (uVar16 < uVar10);
                      moves = (DdNode *)cuddZddSymmSifting_up(table,iVar4,lower,initial_size);
                      pDVar9 = moves;
                      if (moves == (DdNode *)0x0) {
                        do {
                          uVar10 = (uint)uVar20;
                          uVar14 = table->subtableZ[(int)uVar10].next;
                          uVar20 = (ulong)uVar14;
                        } while (uVar10 < uVar14);
LAB_007f800f:
                        if (uVar16 - iVar4 != uVar10 - table->subtableZ[(int)uVar10].next) {
                          if (pDVar8 != (DdNode *)0x0) {
                            pDVar9 = table->nextFree;
                            do {
                              pDVar18 = pDVar8;
                              pDVar8 = (pDVar18->type).kids.T;
                              pDVar18->ref = 0;
                              pDVar18->next = pDVar9;
                              pDVar9 = pDVar18;
                            } while (pDVar8 != (DdNode *)0x0);
                            table->nextFree = pDVar18;
                          }
                          initial_size = table->keysZ;
                          pDVar8 = (DdNode *)
                                   cuddZddSymmSifting_down(table,uVar10,upper,initial_size);
                          pDVar9 = pDVar8;
                        }
                      }
                      else {
                        if (moves == (DdNode *)0x1) goto LAB_007f8263;
                        uVar10 = moves->index;
                        if (table->subtableZ[uVar10].next != uVar10) goto LAB_007f800f;
                      }
                      iVar4 = cuddZddSymmSiftingBackward(table,(Move *)pDVar9,initial_size);
                      bVar21 = iVar4 == 0;
                    }
                    else {
                      moves = (DdNode *)cuddZddSymmSifting_up(table,uVar16,lower,initial_size);
                      if (moves == (DdNode *)0x0) {
                        do {
                          x = uVar16;
                          uVar16 = table->subtableZ[(int)x].next;
                        } while (x < uVar16);
                      }
                      else {
                        if (moves == (DdNode *)0x1) {
                          moves = (DdNode *)0x1;
                          pDVar8 = (DdNode *)0x0;
                          goto LAB_007f8275;
                        }
                        x = moves->index;
                      }
                      uVar10 = table->subtableZ[(int)x].next;
                      pDVar8 = (DdNode *)cuddZddSymmSifting_down(table,x,upper,initial_size);
                      if (pDVar8 == (DdNode *)0x0) {
LAB_007f80aa:
                        uVar20 = (ulong)x;
                        do {
                          uVar14 = (uint)uVar20;
                          uVar16 = table->subtableZ[(int)uVar14].next;
                          uVar20 = (ulong)uVar16;
                        } while (uVar14 < uVar16);
LAB_007f80c3:
                        iVar4 = (int)uVar20;
                        do {
                          uVar14 = (uint)uVar20;
                          uVar16 = table->subtableZ[(int)uVar14].next;
                          uVar20 = (ulong)uVar16;
                        } while (uVar14 < uVar16);
                        if (x - uVar10 == uVar14 - iVar4) {
                          iVar4 = cuddZddSymmSiftingBackward(table,(Move *)pDVar8,initial_size);
                        }
                        else {
                          if (moves != (DdNode *)0x0) {
                            pDVar9 = table->nextFree;
                            do {
                              pDVar18 = moves;
                              moves = (pDVar18->type).kids.T;
                              pDVar18->ref = 0;
                              pDVar18->next = pDVar9;
                              pDVar9 = pDVar18;
                            } while (moves != (DdNode *)0x0);
                            table->nextFree = pDVar18;
                          }
                          uVar10 = table->keysZ;
                          moves = (DdNode *)cuddZddSymmSifting_up(table,iVar4,lower,uVar10);
                          iVar4 = cuddZddSymmSiftingBackward(table,(Move *)moves,uVar10);
                        }
                      }
                      else {
                        if (pDVar8 == (DdNode *)0x1) {
                          pDVar8 = (DdNode *)0x1;
                          goto LAB_007f8275;
                        }
                        uVar20 = (ulong)pDVar8->ref;
                        if (table->subtableZ[uVar20].next != pDVar8->ref) {
                          if (pDVar8 == (DdNode *)0x0) goto LAB_007f80aa;
                          goto LAB_007f80c3;
                        }
                        iVar4 = cuddZddSymmSiftingBackward(table,(Move *)pDVar8,initial_size);
                      }
                      bVar21 = iVar4 == 0;
                    }
                    goto LAB_007f7e5f;
                  }
                  do {
                    uVar14 = (uint)uVar20;
                    uVar10 = pDVar2[(int)uVar14].next;
                    uVar20 = (ulong)uVar10;
                    uVar16 = uVar10;
                  } while (uVar14 < uVar10);
                  do {
                    uVar14 = uVar16;
                    uVar16 = pDVar2[(int)uVar14].next;
                  } while (uVar14 < pDVar2[(int)uVar14].next);
                  moves = (DdNode *)cuddZddSymmSifting_up(table,uVar10,lower,initial_size);
                  if (moves == (DdNode *)0x0) {
                    uVar16 = uVar10;
                    do {
                      uVar13 = uVar16;
                      uVar16 = table->subtableZ[(int)uVar13].next;
                    } while (uVar13 < uVar16);
LAB_007f7df8:
                    if (uVar14 - uVar10 == uVar13 - table->subtableZ[(int)uVar13].next) {
LAB_007f7e13:
                      iVar4 = cuddZddSymmSiftingBackward(table,(Move *)moves,initial_size);
                      pDVar8 = (DdNode *)0x0;
                    }
                    else {
                      uVar10 = table->keysZ;
                      pDVar8 = (DdNode *)cuddZddSymmSifting_down(table,uVar13,upper,uVar10);
                      iVar4 = cuddZddSymmSiftingBackward(table,(Move *)pDVar8,uVar10);
                    }
                    goto LAB_007f7e4e;
                  }
                  if (moves != (DdNode *)0x1) {
                    uVar13 = moves->index;
                    if (table->subtableZ[uVar13].next != uVar13) goto LAB_007f7df8;
                    goto LAB_007f7e13;
                  }
                  pDVar8 = (DdNode *)0x0;
LAB_007f8263:
                  moves = (DdNode *)0x1;
                }
LAB_007f8275:
                if ((DdNode *)0x1 < pDVar8) {
                  pDVar9 = table->nextFree;
                  do {
                    pDVar18 = pDVar8;
                    pDVar8 = (pDVar18->type).kids.T;
                    pDVar18->ref = 0;
                    pDVar18->next = pDVar9;
                    pDVar9 = pDVar18;
                  } while (pDVar8 != (DdNode *)0x0);
                  table->nextFree = pDVar18;
                }
                if ((DdNode *)0x1 < moves) {
                  pDVar8 = table->nextFree;
                  do {
                    pDVar9 = moves;
                    moves = (pDVar9->type).kids.T;
                    pDVar9->ref = 0;
                    pDVar9->next = pDVar8;
                    pDVar8 = pDVar9;
                  } while (moves != (DdNode *)0x0);
                  table->nextFree = pDVar9;
                }
                goto LAB_007f82d9;
              }
LAB_007f7ec5:
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar5);
          }
          bVar21 = table->keysZ < uVar12;
          uVar12 = table->keysZ;
        } while (bVar21);
      }
      iVar4 = 1;
      if (lower <= upper) {
        iVar4 = 0;
        do {
          uVar5 = table->subtableZ[lower].next;
          uVar12 = lower;
          uVar1 = lower;
          while (uVar10 = uVar12, uVar5 != lower) {
            iVar4 = iVar4 + 1;
            uVar5 = table->subtableZ[(int)uVar10].next;
            uVar12 = uVar5;
            uVar1 = uVar10;
          }
          lower = uVar1 + 1;
        } while ((int)uVar1 < upper);
        iVar4 = iVar4 + 1;
      }
      free(__base);
      if (zdd_entry == (int *)0x0) {
        return iVar4;
      }
      free(zdd_entry);
      zdd_entry = (int *)0x0;
      return iVar4;
    }
    table->errorCode = CUDD_MEMORY_OUT;
  }
  __base = (void *)0x0;
LAB_007f82d9:
  if (zdd_entry != (int *)0x0) {
    free(zdd_entry);
    zdd_entry = (int *)0x0;
  }
  if (__base != (void *)0x0) {
    free(__base);
  }
  return 0;
}

Assistant:

int
cuddZddSymmSiftingConv(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         nvars;
    int         initialSize;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
    int         classes;
    int         iteration;
#ifdef DD_STATS
    int         previousSize;
#endif

    initialSize = table->keysZ;

    nvars = table->sizeZ;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, nvars);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSymmSiftingConvOutOfMem;
    }
    var = ABC_ALLOC(int, nvars);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSymmSiftingConvOutOfMem;
    }

    for (i = 0; i < nvars; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, nvars, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Initialize the symmetry of each subtable to itself
    ** for first pass of converging symmetric sifting.
    */
    for (i = lower; i <= upper; i++)
        table->subtableZ[i].next = i;

    iteration = ddMin(table->siftMaxVar, table->sizeZ);
    for (i = 0; i < iteration; i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
        /* Only sift if not in symmetry group already. */
        if (table->subtableZ[x].next == (unsigned) x) {
#ifdef DD_STATS
            previousSize = table->keysZ;
#endif
            result = cuddZddSymmSiftingAux(table, x, lower, upper);
            if (!result)
                goto cuddZddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
            if (table->keysZ < (unsigned) previousSize) {
                (void) fprintf(table->out,"-");
            } else if (table->keysZ > (unsigned) previousSize) {
                (void) fprintf(table->out,"+");
#ifdef DD_VERBOSE
                (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ, var[i]);
#endif
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    /* Sifting now until convergence. */
    while ((unsigned) initialSize > table->keysZ) {
        initialSize = table->keysZ;
#ifdef DD_STATS
        (void) fprintf(table->out,"\n");
#endif
        /* Here we consider only one representative for each symmetry class. */
        for (x = lower, classes = 0; x <= upper; x++, classes++) {
            while ((unsigned) x < table->subtableZ[x].next)
                x = table->subtableZ[x].next;
            /* Here x is the largest index in a group.
            ** Groups consists of adjacent variables.
            ** Hence, the next increment of x will move it to a new group.
            */
            i = table->invpermZ[x];
            zdd_entry[i] = table->subtableZ[x].keys;
            var[classes] = i;
        }

        qsort((void *)var,classes,sizeof(int),(DD_QSFP)cuddZddUniqueCompare);

        /* Now sift. */
        iteration = ddMin(table->siftMaxVar, nvars);
        for (i = 0; i < iteration; i++) {
            if (zddTotalNumberSwapping >= table->siftMaxSwap)
                break;
            x = table->permZ[var[i]];
            if ((unsigned) x >= table->subtableZ[x].next) {
#ifdef DD_STATS
                previousSize = table->keysZ;
#endif
                result = cuddZddSymmSiftingConvAux(table, x, lower, upper);
                if (!result)
                    goto cuddZddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
                if (table->keysZ < (unsigned) previousSize) {
                    (void) fprintf(table->out,"-");
                } else if (table->keysZ > (unsigned) previousSize) {
                    (void) fprintf(table->out,"+");
#ifdef DD_VERBOSE
                (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ, var[i]);
#endif
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        } /* for */
    }

    cuddZddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out,"\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out,"#:G_SIFTING %8d: symmetric groups\n",
                   symgroups);
#endif

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1+symvars);

cuddZddSymmSiftingConvOutOfMem:

    if (zdd_entry != NULL)
        ABC_FREE(zdd_entry);
    if (var != NULL)
        ABC_FREE(var);

    return(0);

}